

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::normalizePagePos(PageViewPrivate *this)

{
  QVariantAnimation *pQVar1;
  int iVar2;
  int iVar3;
  QVariant local_68;
  QVariant local_38;
  int local_14;
  PageViewPrivate *pPStack_10;
  int endPos;
  PageViewPrivate *this_local;
  
  this->indexAfterNormalizeAnimation = -1;
  local_14 = 0;
  pPStack_10 = this;
  iVar2 = qAbs<int>(&this->pagesOffset);
  iVar3 = QWidget::width(this->viewport);
  if (iVar3 / 2 < iVar2) {
    if (this->pagesOffset < 0) {
      iVar2 = PageControl::currentIndex(this->control);
      iVar3 = PageControl::count(this->control);
      if (iVar2 < iVar3 + -1) {
        iVar2 = PageControl::currentIndex(this->control);
        this->indexAfterNormalizeAnimation = iVar2 + 1;
        local_14 = QWidget::width(this->viewport);
        local_14 = -local_14;
        goto LAB_001dd57c;
      }
    }
    if ((0 < this->pagesOffset) && (iVar2 = PageControl::currentIndex(this->control), iVar2 != 0)) {
      iVar2 = PageControl::currentIndex(this->control);
      this->indexAfterNormalizeAnimation = iVar2 + -1;
      local_14 = QWidget::width(this->viewport);
    }
  }
LAB_001dd57c:
  pQVar1 = this->normalizeAnimation;
  QVariant::QVariant(&local_38,this->pagesOffset);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_38);
  pQVar1 = this->normalizeAnimation;
  QVariant::QVariant(&local_68,local_14);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_68);
  QAbstractAnimation::start(this->normalizeAnimation,0);
  return;
}

Assistant:

void
PageViewPrivate::normalizePagePos()
{
	indexAfterNormalizeAnimation = -1;

	int endPos = 0;

	if( qAbs( pagesOffset ) > viewport->width() / 2 )
	{
		if( pagesOffset < 0 && control->currentIndex() < control->count() - 1 )
		{
			indexAfterNormalizeAnimation = control->currentIndex() + 1;

			endPos = - viewport->width();
		}
		else if( pagesOffset > 0 && control->currentIndex() != 0 )
		{
			indexAfterNormalizeAnimation = control->currentIndex() - 1;

			endPos = viewport->width();
		}
	}

	normalizeAnimation->setStartValue( pagesOffset );
	normalizeAnimation->setEndValue( endPos );

	normalizeAnimation->start();
}